

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O2

PtexFaceData * __thiscall Ptex::v2_2::PtexReader::TiledFace::getTile(TiledFace *this,int tile)

{
  FaceData **data;
  pointer ppFVar1;
  FaceData *pFVar2;
  
  ppFVar1 = (this->super_TiledFaceBase)._tiles.
            super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = ppFVar1[tile];
  if (pFVar2 != (FaceData *)0x0) {
    return &pFVar2->super_PtexFaceData;
  }
  data = ppFVar1 + tile;
  readTile(this,tile,data);
  return &(*data)->super_PtexFaceData;
}

Assistant:

virtual PtexFaceData* getTile(int tile)
        {
            FaceData*& f = _tiles[tile];
            if (!f) readTile(tile, f);
            return f;
        }